

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall CLIntercept::callLoggingInfo(CLIntercept *this,char *formatStr,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  string *in_XMM1_Qa;
  CLIntercept *in_XMM1_Qb;
  int size;
  va_list args;
  undefined1 local_148 [16];
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  string *in_stack_fffffffffffffef8;
  CLIntercept *in_stack_ffffffffffffff00;
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [36];
  int local_2c;
  undefined4 local_28;
  undefined4 local_24;
  undefined1 *local_20;
  undefined1 *local_18;
  char *local_10;
  long local_8;
  
  if (in_AL != '\0') {
    local_118 = in_XMM0_Qa;
    in_stack_fffffffffffffef8 = in_XMM1_Qa;
    in_stack_ffffffffffffff00 = in_XMM1_Qb;
  }
  local_18 = local_148;
  local_20 = &stack0x00000008;
  local_24 = 0x30;
  local_28 = 0x10;
  local_138 = in_RDX;
  local_130 = in_RCX;
  local_128 = in_R8;
  local_120 = in_R9;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_2c = vsnprintf((char *)(in_RDI + 0x5070),0x4000,in_RSI,&local_28);
  if ((local_2c < 0) || (0x3fff < local_2c)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"too long",&local_89);
    callLoggingInfo(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,(char *)(in_RDI + 0x5070),&local_51);
    callLoggingInfo(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  return;
}

Assistant:

void CLIntercept::callLoggingInfo(
    const char* formatStr,
    ... )
{
    va_list args;
    va_start( args, formatStr );

    int size = CLI_VSPRINTF( m_StringBuffer, CLI_STRING_BUFFER_SIZE, formatStr, args );
    if( size >= 0 && size < CLI_STRING_BUFFER_SIZE )
    {
        callLoggingInfo( std::string( m_StringBuffer ) );
    }
    else
    {
        callLoggingInfo( std::string( "too long" ) );
    }

    va_end( args );
}